

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::clara::detail::BasicResult<Catch::clara::detail::ParseResultType>::BasicResult
          (BasicResult<Catch::clara::detail::ParseResultType> *this,Type type,string *message)

{
  (this->super_ResultValueBase<Catch::clara::detail::ParseResultType>).super_ResultBase.m_type =
       type;
  (this->super_ResultValueBase<Catch::clara::detail::ParseResultType>).super_ResultBase.
  _vptr_ResultBase = (_func_int **)&PTR__BasicResult_0018b6d8;
  ::std::__cxx11::string::string((string *)&this->m_errorMessage,(string *)message);
  if ((this->super_ResultValueBase<Catch::clara::detail::ParseResultType>).super_ResultBase.m_type
      != Ok) {
    return;
  }
  __assert_fail("m_type != ResultBase::Ok",
                "/workspace/llm4binary/github/license_all_cmakelists_25/discretedynamics[P]cyclone/build_O2/_deps/catch2-src/single_include/catch2/catch.hpp"
                ,0x2349,
                "Catch::clara::detail::BasicResult<Catch::clara::detail::ParseResultType>::BasicResult(ResultBase::Type, const std::string &) [T = Catch::clara::detail::ParseResultType]"
               );
}

Assistant:

BasicResult( ResultBase::Type type, std::string const &message )
        :   ResultValueBase<T>(type),
            m_errorMessage(message)
        {
            assert( m_type != ResultBase::Ok );
        }